

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLiberty.c
# Opt level: O1

void Vec_StrPutI_(Vec_Str_t *vOut,int Val)

{
  int iVar1;
  char *pcVar2;
  uint uVar3;
  ulong uVar4;
  size_t sVar5;
  
  uVar4 = (ulong)(uint)Val;
  if (0x7f < Val) {
    do {
      uVar3 = vOut->nCap;
      if (vOut->nSize == uVar3) {
        if ((int)uVar3 < 0x10) {
          if (vOut->pArray == (char *)0x0) {
            pcVar2 = (char *)malloc(0x10);
          }
          else {
            pcVar2 = (char *)realloc(vOut->pArray,0x10);
          }
          sVar5 = 0x10;
        }
        else {
          sVar5 = (ulong)uVar3 * 2;
          if ((int)sVar5 <= (int)uVar3) goto LAB_0045ebd2;
          if (vOut->pArray == (char *)0x0) {
            pcVar2 = (char *)malloc(sVar5);
          }
          else {
            pcVar2 = (char *)realloc(vOut->pArray,sVar5);
          }
        }
        vOut->pArray = pcVar2;
        vOut->nCap = (int)sVar5;
      }
LAB_0045ebd2:
      uVar3 = (uint)uVar4;
      iVar1 = vOut->nSize;
      vOut->nSize = iVar1 + 1;
      vOut->pArray[iVar1] = (byte)uVar4 | 0x80;
      uVar4 = uVar4 >> 7;
    } while (0x3fff < uVar3);
  }
  uVar3 = vOut->nCap;
  if (vOut->nSize == uVar3) {
    if ((int)uVar3 < 0x10) {
      if (vOut->pArray == (char *)0x0) {
        pcVar2 = (char *)malloc(0x10);
      }
      else {
        pcVar2 = (char *)realloc(vOut->pArray,0x10);
      }
      vOut->pArray = pcVar2;
      sVar5 = 0x10;
    }
    else {
      sVar5 = (ulong)uVar3 * 2;
      if ((int)sVar5 <= (int)uVar3) goto LAB_0045ec6f;
      if (vOut->pArray == (char *)0x0) {
        pcVar2 = (char *)malloc(sVar5);
      }
      else {
        pcVar2 = (char *)realloc(vOut->pArray,sVar5);
      }
      vOut->pArray = pcVar2;
    }
    vOut->nCap = (int)sVar5;
  }
LAB_0045ec6f:
  iVar1 = vOut->nSize;
  vOut->nSize = iVar1 + 1;
  vOut->pArray[iVar1] = (char)uVar4;
  return;
}

Assistant:

static inline void Vec_StrPutI_( Vec_Str_t * vOut, int Val )     { Vec_StrPutI( vOut, Val );  }